

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.h
# Opt level: O1

int hydro_x25519_canon(hydro_x25519_limb_t *x)

{
  ulong *puVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = 0x13;
  lVar3 = 0;
  do {
    puVar1 = x + lVar3;
    uVar5 = *puVar1;
    *puVar1 = *puVar1 + uVar2;
    uVar2 = (ulong)CARRY8(uVar5,uVar2);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  uVar5 = x[3];
  x[3] = uVar5 & 0x7fffffffffffffff;
  uVar2 = (uVar2 << 1 | uVar5 >> 0x3f) * 0x13;
  lVar3 = 0;
  do {
    puVar1 = x + lVar3;
    uVar5 = *puVar1;
    *puVar1 = *puVar1 + uVar2;
    uVar2 = (ulong)CARRY8(uVar5,uVar2);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  lVar4 = -1;
  uVar5 = 0xffffffffffffffed;
  lVar3 = 0;
  uVar2 = 0;
  do {
    uVar6 = uVar5 + x[lVar3];
    uVar5 = lVar4 + (ulong)CARRY8(uVar5,x[lVar3]);
    x[lVar3] = uVar6;
    uVar2 = uVar2 | uVar6;
    lVar4 = (long)uVar5 >> 0x3f;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return (uVar2 != 0) - 1;
}

Assistant:

static int
hydro_x25519_canon(hydro_x25519_fe x)
{
    hydro_x25519_sdlimb_t carry;
    hydro_x25519_limb_t   carry0 = 19;
    hydro_x25519_limb_t   res;
    int                   i;

    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        x[i] = hydro_x25519_adc0(&carry0, x[i]);
    }
    hydro_x25519_propagate(x, carry0);
    carry = -19;
    res   = 0;
    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        res |= x[i] = (hydro_x25519_limb_t) (carry += x[i]);
        carry >>= hydro_x25519_WBITS;
    }
    return ((hydro_x25519_dlimb_t) res - 1) >> hydro_x25519_WBITS;
}